

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * util::
         Join<std::vector<BCLog::Level,std::allocator<BCLog::Level>>,char[3],BCLog::Logger::LogLevelsString[abi:cxx11]()const::__0>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  Level *item;
  vector<BCLog::Level,_std::allocator<BCLog::Level>_> *__range2;
  bool first;
  const_iterator __end0;
  const_iterator __begin0;
  string ret;
  undefined4 in_stack_ffffffffffffff38;
  Level in_stack_ffffffffffffff3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(param_1);
  bVar2 = true;
  std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>::begin
            ((vector<BCLog::Level,_std::allocator<BCLog::Level>_> *)in_stack_ffffffffffffff40);
  std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>::end
            ((vector<BCLog::Level,_std::allocator<BCLog::Level>_> *)in_stack_ffffffffffffff40);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
                      ((__normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
                        *)in_stack_ffffffffffffff48,
                       (__normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
                        *)in_stack_ffffffffffffff40);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __gnu_cxx::
         __normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
         ::operator*((__normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
    }
    const::$_0::operator()::Level__const
              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar2 = false;
    __gnu_cxx::
    __normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
    ::operator++((__normal_iterator<const_BCLog::Level_*,_std::vector<BCLog::Level,_std::allocator<BCLog::Level>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  std::__cxx11::string::string(param_2,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return param_1;
  }
  __stack_chk_fail();
}

Assistant:

auto Join(const C& container, const S& separator, UnaryOp unary_op)
{
    decltype(unary_op(*container.begin())) ret;
    bool first{true};
    for (const auto& item : container) {
        if (!first) ret += separator;
        ret += unary_op(item);
        first = false;
    }
    return ret;
}